

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberDeclaration_Field.h
# Opt level: O1

void __thiscall
psy::C::FieldDeclarationSymbol::~FieldDeclarationSymbol(FieldDeclarationSymbol *this)

{
  unique_ptr<psy::C::Symbol::SymbolImpl,_std::default_delete<psy::C::Symbol::SymbolImpl>_> *this_00;
  
  this_00 = &this[-1].super_MemberDeclarationSymbol.super_DeclarationSymbol.super_Symbol.impl_;
  MemberDeclarationSymbol::~MemberDeclarationSymbol((MemberDeclarationSymbol *)this_00);
  operator_delete(this_00,0x20);
  return;
}

Assistant:

class PSY_C_API FieldDeclarationSymbol final : public MemberDeclarationSymbol
{
public:
    //!@{
    /**
     * Cast \c this Symbol as a FieldDeclarationSymbol.
     */
    virtual FieldDeclarationSymbol* asFieldDeclaration() override { return this; }
    virtual const FieldDeclarationSymbol* asFieldDeclaration() const override { return this; }
    //!@}

    bool isAnonymousStructureOrUnion() const;

PSY_INTERNAL:
    PSY_GRANT_INTERNAL_ACCESS(DeclarationBinder);

    FieldDeclarationSymbol(const Symbol* containingSym,
                           const SyntaxTree* tree,
                           const Scope* enclosingScope);
}